

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache_server_main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  settings *in_stack_00000070;
  exception *e;
  settings par;
  settings *in_stack_ffffffffffffff10;
  char **in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff5c;
  settings *in_stack_ffffffffffffff60;
  value local_38 [6];
  undefined4 local_4;
  
  local_4 = 0;
  settings::settings(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,in_stack_ffffffffffffff50);
  cppcms::impl::setup_logging(local_38);
  main_posix(in_stack_00000070);
  settings::~settings(in_stack_ffffffffffffff10);
  return 0;
}

Assistant:

int main(int argc,char **argv)
{
	try 
	{
		settings par(argc,argv);	
		cppcms::impl::setup_logging(par.config);
#ifndef CPPCMS_WIN32
		main_posix(par);
#elif defined CPPCMS_WIN_NATIVE
		if(cppcms::impl::winservice::is_console(par.config))
			main_console(par);
		else
			main_win(par,argc,argv);
#else // cygwin
		main_console(par);
#endif

	}
	catch(std::exception const &e) {
		BOOSTER_ERROR("cppcms_scale")<<e.what()<<booster::trace(e);
		return 1;
	}
	return 0;
}